

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

QString * wrapText(QString *__return_storage_ptr__,QString *names,int optionNameMaxWidth,
                  QString *description)

{
  char16_t cVar1;
  long lVar2;
  char16_t *pcVar3;
  bool bVar4;
  CutResult CVar5;
  long n;
  qsizetype qVar6;
  int iVar7;
  QArrayData *pQVar8;
  char32_t cVar9;
  QArrayData *pQVar10;
  ulong uVar11;
  QArrayData *pQVar12;
  int iVar13;
  QArrayData *pQVar14;
  long in_FS_OFFSET;
  QString section;
  QString section_1;
  char16_t nl;
  QArrayData *local_e8;
  QString local_b8;
  QString local_98;
  QLatin1String local_78;
  char16_t local_62;
  QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_const_char16_t_&> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_62 = L'\n';
  local_78.m_size = 2;
  local_78.m_data = "  ";
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar2 = (description->d).size;
  n = (long)optionNameMaxWidth;
  if (lVar2 == 0) {
    iVar7 = 0;
  }
  else {
    pQVar10 = (QArrayData *)0x0;
    local_e8 = (QArrayData *)0x0;
    iVar13 = 0;
    iVar7 = 0;
    pQVar14 = (QArrayData *)0xffffffffffffffff;
    do {
      cVar1 = (description->d).ptr[(long)pQVar10];
      cVar9 = (char32_t)(ushort)cVar1;
      pQVar8 = pQVar10;
      if (((((4 < (ushort)cVar1 - 9) && (cVar1 != L' ')) && (pQVar8 = pQVar14, 0x7f < (ushort)cVar1)
           ) && ((pQVar8 = pQVar10, cVar9 != L'\x85' && (cVar9 != L'\xa0')))) &&
         (bVar4 = QChar::isSpace_helper(cVar9), pQVar8 = pQVar14, bVar4)) {
        pQVar8 = pQVar10;
      }
      if ((iVar13 < 0x4c - optionNameMaxWidth) || (pQVar8 == (QArrayData *)0xffffffffffffffff)) {
        if (pQVar10 == (QArrayData *)(lVar2 + -1) ||
            pQVar8 == (QArrayData *)0xffffffffffffffff && 0x4b - optionNameMaxWidth <= iVar13) {
          pQVar14 = (QArrayData *)
                    ((long)&(pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1);
          pQVar12 = pQVar14;
        }
        else {
          pQVar14 = (QArrayData *)
                    ((long)&(pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1);
          pQVar12 = pQVar10;
          if (cVar9 != L'\n') {
            pQVar14 = (QArrayData *)0xffffffffffffffff;
            pQVar12 = (QArrayData *)0xffffffffffffffff;
          }
        }
      }
      else {
        pQVar14 = (QArrayData *)((long)&(pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1);
        pQVar12 = pQVar8;
      }
      if (pQVar12 == (QArrayData *)0xffffffffffffffff) {
        iVar13 = iVar13 + 1;
        pQVar14 = pQVar10;
      }
      else {
        local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::mid(&local_b8,names,(long)iVar7,n);
        iVar7 = iVar7 + (int)local_b8.d.size;
        QString::leftJustified(&local_98,&local_b8,n,(QChar)0x20,false);
        local_60.a.b.d.size = local_98.d.size;
        local_60.a.b.d.ptr = local_98.d.ptr;
        local_60.a.b.d.d = local_98.d.d;
        local_98.d.size = 0;
        local_60.a.a = &local_78;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_60.b = (char16_t *)CONCAT62(local_60.b._2_6_,0x20);
        operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_char16_t> *)
                   &local_60);
        if (&(local_60.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_60.a.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_b8.d.d = (Data *)((long)pQVar12 - (long)local_e8);
        pcVar3 = (description->d).ptr;
        local_98.d.d = (Data *)local_e8;
        CVar5 = QtPrivate::QContainerImplHelper::mid
                          ((description->d).size,(qsizetype *)&local_98,(qsizetype *)&local_b8);
        if (CVar5 == Null) {
          local_60.a.a = (QLatin1String *)0x0;
          local_60.a.b.d.d = (Data *)0x0;
        }
        else {
          local_60.a.b.d.d = (Data *)(pcVar3 + (long)local_98.d.d);
          local_60.a.a = (QLatin1String *)local_b8.d.d;
        }
        local_60.a.b.d.ptr = &local_62;
        operator+=(__return_storage_ptr__,(QStringBuilder<QStringView,_const_char16_t_&> *)&local_60
                  );
        iVar13 = 0;
        pQVar8 = (QArrayData *)0xffffffffffffffff;
        local_e8 = pQVar14;
        if ((long)pQVar14 < lVar2) {
          cVar1 = (description->d).ptr[(long)pQVar14];
          uVar11 = 1;
          if ((4 < (ushort)cVar1 - 9) && (cVar1 != L' ')) {
            if ((ushort)cVar1 < 0x80) {
              uVar11 = 0;
            }
            else {
              cVar9 = (char32_t)(ushort)cVar1;
              if ((cVar9 != L'\x85') && (cVar9 != L'\xa0')) {
                bVar4 = QChar::isSpace_helper(cVar9);
                uVar11 = (ulong)bVar4;
              }
            }
          }
          pQVar14 = (QArrayData *)
                    ((long)&(pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + uVar11);
          local_e8 = pQVar14;
        }
      }
      pQVar10 = (QArrayData *)((long)&(pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1);
      pQVar14 = pQVar8;
    } while ((long)pQVar10 < lVar2);
  }
  qVar6 = (qsizetype)iVar7;
  if (qVar6 < (names->d).size) {
    do {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::mid(&local_98,names,qVar6,n);
      qVar6 = local_98.d.size;
      local_60.a.b.d.ptr = local_98.d.ptr;
      local_60.a.b.d.d = local_98.d.d;
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char16_t *)0x0;
      local_98.d.size = 0;
      local_60.a.b.d.size = qVar6;
      local_60.a.a = &local_78;
      local_60.b = &local_62;
      operator+=(__return_storage_ptr__,&local_60);
      if (&(local_60.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_60.a.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar7 = iVar7 + (int)qVar6;
      qVar6 = (qsizetype)iVar7;
    } while (qVar6 < (names->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString wrapText(const QString &names, int optionNameMaxWidth, const QString &description)
{
    const auto nl = u'\n';
    const auto indentation = "  "_L1;

    // In case the list of option names is very long, wrap it as well
    int nameIndex = 0;
    auto nextNameSection = [&]() {
        QString section = names.mid(nameIndex, optionNameMaxWidth);
        nameIndex += section.size();
        return section;
    };

    QString text;
    qsizetype lineStart = 0;
    qsizetype lastBreakable = -1;
    const int max = 79 - (indentation.size() + optionNameMaxWidth + 1);
    int x = 0;
    const qsizetype len = description.size();

    for (qsizetype i = 0; i < len; ++i) {
        ++x;
        const QChar c = description.at(i);
        if (c.isSpace())
            lastBreakable = i;

        qsizetype breakAt = -1;
        qsizetype nextLineStart = -1;
        if (x > max && lastBreakable != -1) {
            // time to break and we know where
            breakAt = lastBreakable;
            nextLineStart = lastBreakable + 1;
        } else if ((x > max - 1 && lastBreakable == -1) || i == len - 1) {
            // time to break but found nowhere [-> break here], or end of last line
            breakAt = i + 1;
            nextLineStart = breakAt;
        } else if (c == nl) {
            // forced break
            breakAt = i;
            nextLineStart = i + 1;
        }

        if (breakAt != -1) {
            const qsizetype numChars = breakAt - lineStart;
            //qDebug() << "breakAt=" << description.at(breakAt) << "breakAtSpace=" << breakAtSpace << lineStart << "to" << breakAt << description.mid(lineStart, numChars);
            text += indentation + nextNameSection().leftJustified(optionNameMaxWidth) + u' ';
            text += QStringView{description}.mid(lineStart, numChars) + nl;
            x = 0;
            lastBreakable = -1;
            lineStart = nextLineStart;
            if (lineStart < len && description.at(lineStart).isSpace())
                ++lineStart; // don't start a line with a space
            i = lineStart;
        }
    }

    while (nameIndex < names.size()) {
        text += indentation + nextNameSection() + nl;
    }

    return text;
}